

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asio_service.cxx
# Opt level: O3

void __thiscall
nuraft::rpc_session::handle_handshake(rpc_session *this,ptr<rpc_session> *self,error_code *err)

{
  uint uVar1;
  uint uVar2;
  element_type *peVar3;
  uint64_t uVar4;
  int iVar5;
  ptr<asio::steady_timer> timer;
  undefined1 local_90 [16];
  undefined1 local_80 [56];
  ptr<rpc_session> local_48;
  pointer local_38;
  
  peVar3 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (err->_M_value == 0) {
    if ((peVar3 != (element_type *)0x0) && (iVar5 = (*peVar3->_vptr_logger[7])(), 3 < iVar5)) {
      peVar3 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      msg_if_given_abi_cxx11_
                ((string *)local_90,"session %lu handshake with %s:%u succeeded (as a server)",
                 this->session_id_,(this->cached_address_)._M_dataplus._M_p,
                 (ulong)this->cached_port_);
      (*peVar3->_vptr_logger[8])
                (peVar3,4,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/asio_service.cxx"
                 ,"handle_handshake",0x11e,(string *)local_90);
      if ((element_type *)local_90._0_8_ != (element_type *)(local_90 + 0x10)) {
        operator_delete((void *)local_90._0_8_);
      }
    }
    local_48.super___shared_ptr<nuraft::rpc_session,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (self->super___shared_ptr<nuraft::rpc_session,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    local_48.super___shared_ptr<nuraft::rpc_session,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (self->super___shared_ptr<nuraft::rpc_session,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
         _M_pi;
    if (local_48.super___shared_ptr<nuraft::rpc_session,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_48.super___shared_ptr<nuraft::rpc_session,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_use_count =
             (local_48.super___shared_ptr<nuraft::rpc_session,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_48.super___shared_ptr<nuraft::rpc_session,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_use_count =
             (local_48.super___shared_ptr<nuraft::rpc_session,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    start(this,&local_48);
    local_80._32_8_ =
         local_48.super___shared_ptr<nuraft::rpc_session,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
         _M_pi;
  }
  else {
    if ((peVar3 != (element_type *)0x0) && (iVar5 = (*peVar3->_vptr_logger[7])(), 1 < iVar5)) {
      peVar3 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      uVar4 = this->session_id_;
      local_38 = (this->cached_address_)._M_dataplus._M_p;
      uVar1 = this->cached_port_;
      uVar2 = err->_M_value;
      (**(code **)(*(long *)err->_M_cat + 0x20))(local_80 + 0x18,err->_M_cat,uVar2);
      msg_if_given_abi_cxx11_
                ((string *)local_90,"session %lu handshake with %s:%u failed: error %d, %s",uVar4,
                 local_38,(ulong)uVar1,(ulong)uVar2,local_80._24_8_);
      (*peVar3->_vptr_logger[8])
                (peVar3,2,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/asio_service.cxx"
                 ,"handle_handshake",0x127,local_90);
      if ((element_type *)local_90._0_8_ != (element_type *)(local_90 + 0x10)) {
        operator_delete((void *)local_90._0_8_);
      }
      if ((basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>
           *)local_80._24_8_ !=
          (basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>
           *)(local_80 + 0x28)) {
        operator_delete((void *)local_80._24_8_);
      }
    }
    local_80._24_8_ =
         (basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>
          *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,asio::wait_traits<std::chrono::_V2::steady_clock>,asio::any_io_executor>,std::allocator<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,asio::wait_traits<std::chrono::_V2::steady_clock>,asio::any_io_executor>>,asio::io_context&>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_80 + 0x20),
               (basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>
                **)(local_80 + 0x18),
               (allocator<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>_>
                *)local_90,&this->impl_->io_svc_);
    local_90._0_8_ = (pointer)0x1dcd6500;
    asio::
    basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>
    ::expires_after((basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>
                     *)local_80._24_8_,(duration *)local_90);
    local_90._0_8_ =
         (self->super___shared_ptr<nuraft::rpc_session,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    local_90._8_8_ =
         (self->super___shared_ptr<nuraft::rpc_session,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
         _M_pi;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_90._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_90._8_8_)->_M_use_count =
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_90._8_8_)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_90._8_8_)->_M_use_count =
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_90._8_8_)->_M_use_count + 1;
      }
    }
    local_80._8_8_ = local_80._24_8_;
    local_80._16_8_ = local_80._32_8_;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_80._32_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(_Atomic_word *)(local_80._32_8_ + 8) = *(_Atomic_word *)(local_80._32_8_ + 8) + 1;
        UNLOCK();
      }
      else {
        *(_Atomic_word *)(local_80._32_8_ + 8) = *(_Atomic_word *)(local_80._32_8_ + 8) + 1;
      }
    }
    local_80._0_8_ = this;
    asio::detail::
    deadline_timer_service<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,asio::wait_traits<std::chrono::_V2::steady_clock>>>
    ::
    async_wait<nuraft::rpc_session::handle_handshake(std::shared_ptr<nuraft::rpc_session>,std::error_code_const&)::_lambda(std::error_code_const&)_1_,asio::any_io_executor>
              ((deadline_timer_service<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,asio::wait_traits<std::chrono::_V2::steady_clock>>>
                *)((io_object_impl<asio::detail::deadline_timer_service<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>,_asio::any_io_executor>
                    *)local_80._24_8_)->service_,
               &((io_object_impl<asio::detail::deadline_timer_service<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>,_asio::any_io_executor>
                  *)local_80._24_8_)->implementation_,(anon_class_40_3_33732ff9 *)local_90,
               &((io_object_impl<asio::detail::deadline_timer_service<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>,_asio::any_io_executor>
                  *)local_80._24_8_)->executor_);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_80._16_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_80._16_8_);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_90._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_90._8_8_);
    }
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_80._32_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_80._32_8_);
  }
  return;
}

Assistant:

void handle_handshake(ptr<rpc_session> self,
                          const ERROR_CODE& err) {
        if (!err) {
            p_in( "session %" PRIu64 " handshake with %s:%u succeeded (as a server)",
                  session_id_,
                  cached_address_.c_str(),
                  cached_port_ );
            this->start(self);

        } else {
            p_er( "session %" PRIu64 " handshake with %s:%u failed: error %d, %s",
                  session_id_,
                  cached_address_.c_str(),
                  cached_port_,
                  err.value(),
                  err.message().c_str() );

            // Lazy stop.
            ptr<asio::steady_timer> timer =
                cs_new<asio::steady_timer>(impl_->get_io_svc());
            timer->expires_after
                   ( std::chrono::duration_cast<std::chrono::nanoseconds>
                     ( std::chrono::milliseconds( SSL_GRACE_PERIOD_MS ) ) );
            timer->async_wait( [self, this, timer]
                               (const ERROR_CODE& err) -> void
            {
                if (err) {
                    p_er("session %" PRIu64 " error happend during "
                         "async wait: %d, %s",
                         session_id_,
                         err.value(),
                         err.message().c_str());
                }
                this->stop();
            });
        }
    }